

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void sigsegv_handler(int sig,siginfo_t *siginfo,void *context)

{
  int iVar1;
  char *pcVar2;
  Dl_info info;
  char *local_38 [4];
  
  iVar1 = dladdr(*(undefined8 *)((long)context + 0xa8),local_38);
  if ((iVar1 != 0) && (pcVar2 = strstr(local_38[0],"libforestdb"), pcVar2 != (char *)0x0)) {
    sigsegv_handler();
    return;
  }
  if (caller_sigact.__sigaction_handler.sa_handler != (__sighandler_t)0x0) {
    if (((byte)caller_sigact.sa_flags & 4) != 0) {
      (*caller_sigact.__sigaction_handler.sa_handler)(sig);
      return;
    }
    if (caller_sigact.__sigaction_handler.sa_handler != (__sighandler_t)0x0) {
      (*caller_sigact.__sigaction_handler.sa_handler)(sig);
      return;
    }
  }
  sigaction(0xb,(sigaction *)&caller_sigact,(sigaction *)0x0);
  _dbg_hang_process();
  initialize_breakpad(minidump_dir);
  return;
}

Assistant:

static void sigsegv_handler(int sig, siginfo_t *siginfo, void *context)
{
    ucontext_t* u = (ucontext_t*)context;
#if defined(__aarch64__)
    unsigned char *pc = (unsigned char*)u->uc_mcontext.pc;
#elif defined(REG_RIP) // Test if the Program Counter is 64 bits
    unsigned char *pc = (unsigned char *)u->uc_mcontext.gregs[REG_RIP];
#else // 32 bit machine, PC is stored in %eip register
    unsigned char *pc = (unsigned char *)u->uc_mcontext.gregs[REG_EIP];
#endif // REG_RIP for 64-bit machines

    Dl_info info;
    if (dladdr(pc, &info)) { // Determine location of the segfault..
        if (strstr(info.dli_fname, "libforestdb")) {
            fprintf(stderr,
                    "Caught SIGSEGV in libforestdb at %s\n", info.dli_sname);
            // first restore original handler whatever it may be..
            // so that if BREAKPAD is not available we get a core dump..
            sigaction(SIGSEGV, &caller_sigact, NULL);
            _dbg_hang_process();
            initialize_breakpad(minidump_dir);
            return; // let breakpad dump backtrace and crash..
        }
    }
    // If not from forestdb, and caller has a signal handler, invoke it..
    if (caller_sigact.sa_sigaction && caller_sigact.sa_flags & SA_SIGINFO) {
        caller_sigact.sa_sigaction(sig, siginfo, context);
    } else if (caller_sigact.sa_sigaction) { // Not in forestdb and no handler from caller
        caller_sigact.sa_handler(sig);
    } else {
        // first restore original handler whatever it may be..
        // so that if BREAKPAD is not available we get a core dump..
        sigaction(SIGSEGV, &caller_sigact, NULL);
        _dbg_hang_process();
        initialize_breakpad(minidump_dir); // let breakpad handle it..
    }
}